

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

void roaring_bitmap_remove_range_closed(roaring_bitmap_t *r,uint32_t min,uint32_t max)

{
  uint8_t uVar1;
  ushort uVar2;
  uint8_t *puVar3;
  array_container_t *c;
  uint16_t *puVar4;
  shared_container_t *sc;
  array_container_t *run;
  byte bVar5;
  uint uVar6;
  void **ppvVar7;
  rle16_t *prVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  ushort uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  int iVar21;
  ulong uVar22;
  ulong uVar23;
  ushort uVar24;
  byte bVar25;
  ulong uVar26;
  uint8_t local_60;
  uint local_58;
  
  if (min <= max) {
    iVar14 = (r->high_low_container).size;
    if (iVar14 == 0) {
      uVar18 = 0;
    }
    else {
      if (iVar14 < 1) {
        uVar18 = 0xffffffff;
      }
      else {
        iVar21 = iVar14 + -1;
        uVar19 = 0;
        do {
          uVar18 = iVar21 + uVar19 >> 1;
          uVar17 = *(ushort *)
                    ((long)(r->high_low_container).keys + (ulong)(iVar21 + uVar19 & 0xfffffffe));
          uVar24 = (ushort)(min >> 0x10);
          if (uVar17 < uVar24) {
            uVar19 = uVar18 + 1;
          }
          else {
            if (uVar17 <= uVar24) goto LAB_0011283c;
            iVar21 = uVar18 - 1;
          }
        } while ((int)uVar19 <= iVar21);
        uVar18 = ~uVar19;
      }
LAB_0011283c:
      uVar18 = (int)uVar18 >> 0x1f ^ uVar18;
    }
    if ((int)uVar18 < iVar14) {
      uVar26 = (ulong)(int)uVar18;
      local_58 = uVar18;
      do {
        uVar17 = (r->high_low_container).keys[uVar26];
        uVar19 = (uint)uVar26;
        if (max >> 0x10 < (uint)uVar17) break;
        uVar19 = 0;
        if (min >> 0x10 == (uint)uVar17) {
          uVar19 = min & 0xffff;
        }
        uVar6 = 0xffff;
        if (max >> 0x10 == (uint)uVar17) {
          uVar6 = max & 0xffff;
        }
        if (iVar14 <= (int)((uint)uVar26 & 0xffff)) {
          __assert_fail("i < ra->size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                        ,0x1a95,"void ra_unshare_container_at_index(roaring_array_t *, uint16_t)");
        }
        ppvVar7 = (r->high_low_container).containers;
        puVar3 = (r->high_low_container).typecodes;
        uVar11 = uVar26 & 0xffff;
        sc = (shared_container_t *)ppvVar7[uVar11];
        if (puVar3[uVar11] == '\x04') {
          sc = (shared_container_t *)shared_container_extract_copy(sc,puVar3 + uVar11);
          ppvVar7 = (r->high_low_container).containers;
        }
        ppvVar7[uVar11] = sc;
        run = (array_container_t *)(r->high_low_container).containers[uVar26];
        uVar1 = (r->high_low_container).typecodes[uVar26];
        uVar24 = (ushort)uVar6;
        uVar17 = (ushort)uVar19;
        if (uVar1 == '\x03') {
          iVar14 = run->cardinality;
          lVar12 = (long)iVar14;
          if ((lVar12 == 0) ||
             ((prVar8 = (rle16_t *)run->array, uVar19 <= prVar8->value &&
              ((ushort)(prVar8[lVar12 + -1].length + prVar8[lVar12 + -1].value) <= uVar6))))
          goto LAB_00112e3f;
          if (iVar14 < 1) {
            uVar11 = 0xffffffff;
            uVar20 = 0xffffffff;
LAB_00112d03:
            uVar20 = ~uVar20;
LAB_00112d06:
            uVar19 = (uint)uVar11;
            if ((int)uVar19 < 0) {
              uVar19 = -uVar19 - 2;
            }
            else {
              uVar17 = prVar8[uVar11].length + prVar8[uVar11].value;
              if (uVar6 < uVar17) {
                prVar8[uVar11].value = uVar24 + 1;
                prVar8[uVar11].length = uVar17 - (uVar24 + 1);
                uVar19 = uVar19 - 1;
              }
            }
            if ((int)uVar20 <= (int)uVar19) {
              uVar19 = ~uVar19;
              iVar21 = iVar14 + uVar19;
              iVar10 = uVar20 + uVar19;
              if ((iVar10 != 0 && SCARRY4(uVar20,uVar19) == iVar10 < 0) &&
                 (run->capacity < iVar10 + iVar21)) {
                run_container_grow((run_container_t *)run,iVar10 + iVar21,true);
                iVar14 = run->cardinality;
                prVar8 = (rle16_t *)run->array;
              }
              memmove(prVar8 + ((iVar14 - iVar21) + iVar10),prVar8 + (iVar14 - iVar21),
                      (long)iVar21 << 2);
              iVar14 = iVar10 + run->cardinality;
              run->cardinality = iVar14;
            }
          }
          else {
            iVar10 = iVar14 + -1;
            uVar20 = 0;
            iVar21 = iVar10;
            do {
              uVar13 = iVar21 + uVar20 >> 1;
              uVar22 = (ulong)uVar13;
              if ((ushort)(prVar8[uVar22].length + prVar8[uVar22].value) < uVar17) {
                uVar20 = uVar13 + 1;
              }
              else {
                if (prVar8[uVar22].value <= uVar17) goto LAB_001129fd;
                iVar21 = uVar13 - 1;
              }
            } while ((int)uVar20 <= iVar21);
            uVar22 = (ulong)~uVar20;
LAB_001129fd:
            uVar20 = (uint)uVar22;
            uVar13 = 0;
            do {
              uVar9 = iVar10 + uVar13 >> 1;
              uVar11 = (ulong)uVar9;
              if ((ushort)(prVar8[uVar11].length + prVar8[uVar11].value) < uVar24) {
                uVar13 = uVar9 + 1;
              }
              else {
                if (prVar8[uVar11].value <= uVar24) goto LAB_00112a31;
                iVar10 = uVar9 - 1;
              }
            } while ((int)uVar13 <= iVar10);
            uVar11 = (ulong)~uVar13;
LAB_00112a31:
            if ((int)uVar20 < 0) goto LAB_00112d03;
            uVar2 = prVar8[uVar22].value;
            if (uVar19 <= uVar2) goto LAB_00112d06;
            if ((uint)prVar8[uVar22].length + (uint)uVar2 <= uVar6) {
              prVar8[uVar22].length = uVar17 + ~uVar2;
              uVar20 = uVar20 + 1;
              goto LAB_00112d06;
            }
            if (run->capacity <= iVar14) {
              run_container_grow((run_container_t *)run,iVar14 + 1,true);
              iVar14 = run->cardinality;
              prVar8 = (rle16_t *)run->array;
            }
            uVar20 = uVar20 + 1;
            uVar19 = uVar20 & 0xffff;
            memmove(prVar8 + (ulong)uVar19 + 1,prVar8 + uVar19,(long)(int)(iVar14 - uVar19) << 2);
            iVar14 = run->cardinality + 1;
            run->cardinality = iVar14;
            prVar8 = (rle16_t *)run->array;
            prVar8[uVar20].value = uVar24 + 1;
            uVar2 = prVar8[uVar22].value;
            prVar8[uVar20].length = ~uVar24 + uVar2 + prVar8[uVar22].length;
            prVar8[uVar22].length = uVar17 + ~uVar2;
          }
          local_60 = '\x03';
          if (0x1ffe < iVar14 * 4) {
            run = (array_container_t *)bitset_container_from_run((run_container_t *)run);
            goto LAB_00112f25;
          }
        }
        else if (uVar1 == '\x02') {
          prVar8 = (rle16_t *)run->array;
          uVar19 = run->cardinality;
          uVar11 = 0;
          if (uVar19 == 0) {
            uVar6 = 0;
          }
          else {
            uVar11 = 0;
            uVar6 = uVar19;
            if (0 < (int)uVar19) {
              iVar14 = uVar19 - 1;
              iVar21 = 0;
              do {
                uVar20 = (uint)(iVar14 + iVar21) >> 1;
                uVar2 = *(ushort *)((long)&prVar8->value + (ulong)(iVar14 + iVar21 & 0xfffffffe));
                if (uVar2 < uVar24) {
                  iVar21 = uVar20 + 1;
                }
                else {
                  if (uVar2 <= uVar24) {
                    uVar9 = ~uVar20;
                    uVar6 = uVar19 + uVar9;
                    uVar13 = 0xffffffff;
                    if (uVar20 == 0x7fffffff) goto LAB_00112e00;
                    goto LAB_00112dd4;
                  }
                  iVar14 = uVar20 - 1;
                }
              } while (iVar21 <= iVar14);
              iVar14 = -iVar21;
              if (0 < iVar21) {
                iVar14 = iVar21;
              }
              uVar6 = uVar19 - iVar14;
              if (iVar21 == 0) {
                uVar11 = 0;
              }
              else {
                uVar9 = -iVar14;
LAB_00112dd4:
                uVar9 = ~uVar9;
                uVar20 = 0;
                do {
                  uVar13 = uVar9 + uVar20 >> 1;
                  uVar24 = *(ushort *)((long)&prVar8->value + (ulong)(uVar9 + uVar20 & 0xfffffffe));
                  if (uVar24 < uVar17) {
                    uVar20 = uVar13 + 1;
                  }
                  else {
                    if (uVar24 <= uVar17) goto LAB_00112e00;
                    uVar9 = uVar13 - 1;
                  }
                } while ((int)uVar20 <= (int)uVar9);
                uVar13 = ~uVar20;
LAB_00112e00:
                uVar11 = (ulong)((int)uVar13 >> 0x1f ^ uVar13);
              }
            }
          }
          iVar14 = (int)uVar11 + uVar6;
          if (iVar14 == 0) {
LAB_00112e3f:
            run = (array_container_t *)0x0;
          }
          else {
            local_60 = '\x02';
            iVar14 = uVar19 - iVar14;
            if (iVar14 != 0) {
              memmove(&prVar8->value + uVar11,&prVar8->value + (uint)((int)uVar11 + iVar14),
                      (ulong)uVar6 * 2);
              run->cardinality = run->cardinality - iVar14;
            }
          }
        }
        else {
          prVar8 = (rle16_t *)run->array;
          uVar20 = uVar19 >> 6;
          uVar22 = (ulong)uVar20;
          uVar13 = uVar6 >> 6;
          uVar11 = *(ulong *)(prVar8 + uVar22 * 2);
          bVar25 = (byte)uVar6;
          bVar5 = (byte)uVar19;
          if (uVar13 == uVar20) {
            uVar15 = (0xffffffffffffffffU >> (~bVar25 + bVar5 & 0x3f)) << (bVar5 & 0x3f) & uVar11;
            uVar15 = uVar15 - (uVar15 >> 1 & 0x5555555555555555);
            uVar15 = (uVar15 >> 2 & 0x3333333333333333) + (uVar15 & 0x3333333333333333);
            uVar9 = (uint)(byte)(((uVar15 >> 4) + uVar15 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >>
                                0x38);
          }
          else {
            uVar15 = (uVar11 >> (bVar5 & 0x3f)) << (bVar5 & 0x3f);
            uVar15 = uVar15 - (uVar15 >> 1 & 0x5555555555555555);
            uVar15 = (uVar15 >> 2 & 0x3333333333333333) + (uVar15 & 0x3333333333333333);
            uVar15 = ((uVar15 >> 4) + uVar15 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
            uVar16 = uVar15 >> 0x38;
            uVar9 = (uint)(byte)(uVar15 >> 0x38);
            if (uVar20 + 1 < uVar13) {
              uVar15 = (ulong)(uVar20 + 1);
              do {
                uVar23 = *(ulong *)(prVar8 + uVar15 * 2) -
                         (*(ulong *)(prVar8 + uVar15 * 2) >> 1 & 0x5555555555555555);
                uVar23 = (uVar23 >> 2 & 0x3333333333333333) + (uVar23 & 0x3333333333333333);
                uVar9 = (int)uVar16 +
                        (uint)(byte)(((uVar23 >> 4) + uVar23 & 0xf0f0f0f0f0f0f0f) *
                                     0x101010101010101 >> 0x38);
                uVar16 = (ulong)uVar9;
                uVar15 = uVar15 + 1;
              } while (uVar13 != uVar15);
            }
            uVar15 = (ulong)(*(long *)(prVar8 + (ulong)uVar13 * 2) << (~bVar25 & 0x3f)) >>
                     (~bVar25 & 0x3f);
            uVar15 = uVar15 - (uVar15 >> 1 & 0x5555555555555555);
            uVar15 = (uVar15 >> 2 & 0x3333333333333333) + (uVar15 & 0x3333333333333333);
            uVar9 = (byte)(((uVar15 >> 4) + uVar15 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38)
                    + uVar9;
          }
          iVar14 = run->cardinality - uVar9;
          if (iVar14 == 0) goto LAB_00112e3f;
          if (iVar14 < 0x1000) {
            if (uVar6 + 1 != uVar19) {
              uVar15 = -1L << (bVar5 & 0x3f);
              if (uVar13 == uVar20) {
                uVar15 = (uVar15 << (~bVar25 & 0x3f)) >> (~bVar25 & 0x3f);
              }
              else {
                *(ulong *)(prVar8 + uVar22 * 2) = uVar11 & ~uVar15;
                if (uVar20 + 1 < uVar13) {
                  memset(prVar8 + uVar22 * 2 + 2,0,(ulong)((uVar13 - uVar20) - 2) * 8 + 8);
                }
                uVar15 = 0xffffffffffffffff >> (~bVar25 & 0x3f);
                uVar22 = (ulong)uVar13;
                uVar11 = *(ulong *)(prVar8 + uVar22 * 2);
              }
              *(ulong *)(prVar8 + uVar22 * 2) = ~uVar15 & uVar11;
            }
            run->cardinality = iVar14;
            run = array_container_from_bitset((bitset_container_t *)run);
            local_60 = '\x02';
            goto LAB_00112f2a;
          }
          if (uVar6 + 1 != uVar19) {
            uVar15 = -1L << (bVar5 & 0x3f);
            if (uVar13 == uVar20) {
              uVar15 = (uVar15 << (~bVar25 & 0x3f)) >> (~bVar25 & 0x3f);
            }
            else {
              *(ulong *)(prVar8 + uVar22 * 2) = uVar11 & ~uVar15;
              if (uVar20 + 1 < uVar13) {
                memset(prVar8 + uVar22 * 2 + 2,0,(ulong)((uVar13 - uVar20) - 2) * 8 + 8);
              }
              uVar15 = 0xffffffffffffffff >> (~bVar25 & 0x3f);
              uVar22 = (ulong)uVar13;
              uVar11 = *(ulong *)(prVar8 + uVar22 * 2);
            }
            *(ulong *)(prVar8 + uVar22 * 2) = ~uVar15 & uVar11;
          }
          run->cardinality = iVar14;
LAB_00112f25:
          local_60 = '\x01';
        }
LAB_00112f2a:
        c = (array_container_t *)(r->high_low_container).containers[uVar26];
        if (run != c) {
          container_free(c,(r->high_low_container).typecodes[uVar26]);
        }
        iVar14 = (r->high_low_container).size;
        if (run != (array_container_t *)0x0) {
          if (iVar14 <= (int)local_58) {
            __assert_fail("i < ra->size",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                          ,0x1a55,
                          "void ra_replace_key_and_container_at_index(roaring_array_t *, int32_t, uint16_t, container_t *, uint8_t)"
                         );
          }
          puVar4 = (r->high_low_container).keys;
          lVar12 = (long)(int)local_58;
          puVar4[lVar12] = puVar4[uVar26];
          (r->high_low_container).containers[lVar12] = run;
          (r->high_low_container).typecodes[lVar12] = local_60;
          local_58 = local_58 + 1;
          iVar14 = (r->high_low_container).size;
        }
        uVar26 = uVar26 + 1;
        uVar18 = uVar18 + 1;
        uVar19 = uVar18;
      } while ((long)uVar26 < (long)iVar14);
      if ((int)local_58 < (int)uVar19) {
        ra_shift_tail(&r->high_low_container,iVar14 - uVar19,local_58 - uVar19);
        return;
      }
    }
  }
  return;
}

Assistant:

void roaring_bitmap_remove_range_closed(roaring_bitmap_t *r, uint32_t min, uint32_t max) {
    if (min > max) {
        return;
    }

    roaring_array_t *ra = &r->high_low_container;

    uint32_t min_key = min >> 16;
    uint32_t max_key = max >> 16;

    int32_t src = count_less(ra->keys, ra->size, min_key);
    int32_t dst = src;
    while (src < ra->size && ra->keys[src] <= max_key) {
        uint32_t container_min = (min_key == ra->keys[src]) ? (min & 0xffff) : 0;
        uint32_t container_max = (max_key == ra->keys[src]) ? (max & 0xffff) : 0xffff;
        ra_unshare_container_at_index(ra, src);
        container_t *new_container;
        uint8_t new_type;
        new_container = container_remove_range(ra->containers[src],
                                               ra->typecodes[src],
                                               container_min, container_max,
                                               &new_type);
        if (new_container != ra->containers[src]) {
            container_free(ra->containers[src],
                           ra->typecodes[src]);
        }
        if (new_container) {
            ra_replace_key_and_container_at_index(ra, dst, ra->keys[src],
                                                  new_container, new_type);
            dst++;
        }
        src++;
    }
    if (src > dst) {
        ra_shift_tail(ra, ra->size - src, dst - src);
    }
}